

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error epilogProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  XML_Parsing XVar1;
  int iVar2;
  XML_Error XVar3;
  char *next;
  char *local_30;
  
  parser->m_processor = epilogProcessor;
  parser->m_eventPtr = s;
  do {
    local_30 = (char *)0x0;
    iVar2 = (*parser->m_encoding->scanners[0])(parser->m_encoding,s,end,&local_30);
    parser->m_eventEndPtr = local_30;
    XVar3 = XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
    if (iVar2 < 0xd) {
      if (iVar2 != 0xb) {
        switch(iVar2) {
        case 0:
          parser->m_eventPtr = local_30;
          return XML_ERROR_INVALID_TOKEN;
        case -4:
          goto switchD_0043853d_caseD_fffffffc;
        case -3:
          goto switchD_0043853d_caseD_fffffffd;
        case -2:
          XVar3 = XML_ERROR_PARTIAL_CHAR;
          break;
        case -1:
          XVar3 = XML_ERROR_UNCLOSED_TOKEN;
          break;
        default:
          if (iVar2 != -0xf) {
            return XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
          }
          if ((parser->m_defaultHandler != (XML_DefaultHandler)0x0) &&
             (reportDefault(parser,parser->m_encoding,s,local_30),
             (parser->m_parsingStatus).parsing == XML_FINISHED)) {
            return XML_ERROR_ABORTED;
          }
          *nextPtr = local_30;
          goto LAB_004385a0;
        }
        if ((parser->m_parsingStatus).finalBuffer != '\0') {
          return XVar3;
        }
        break;
      }
      iVar2 = reportProcessingInstruction(parser,parser->m_encoding,s,local_30);
LAB_00438500:
      if (iVar2 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
    }
    else {
      if (iVar2 == 0xd) {
        iVar2 = reportComment(parser,parser->m_encoding,s,local_30);
        goto LAB_00438500;
      }
      if (iVar2 != 0xf) {
        return XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
      }
      if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
        reportDefault(parser,parser->m_encoding,s,local_30);
      }
    }
    parser->m_eventPtr = local_30;
    XVar1 = (parser->m_parsingStatus).parsing;
    if (XVar1 == XML_FINISHED) {
      return XML_ERROR_ABORTED;
    }
    s = local_30;
  } while (XVar1 != XML_SUSPENDED);
switchD_0043853d_caseD_fffffffc:
  *nextPtr = s;
LAB_004385a0:
  XVar3 = XML_ERROR_NONE;
switchD_0043853d_caseD_fffffffd:
  return XVar3;
}

Assistant:

static enum XML_Error PTRCALL
epilogProcessor(XML_Parser parser,
                const char *s,
                const char *end,
                const char **nextPtr)
{
  processor = epilogProcessor;
  eventPtr = s;
  for (;;) {
    const char *next = NULL;
    int tok = XmlPrologTok(encoding, s, end, &next);
    eventEndPtr = next;
    switch (tok) {
    /* report partial linebreak - it might be the last token */
    case -XML_TOK_PROLOG_S:
      if (defaultHandler) {
        reportDefault(parser, encoding, s, next);
        if (ps_parsing == XML_FINISHED)
          return XML_ERROR_ABORTED;
      }
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_TOK_NONE:
      *nextPtr = s;
      return XML_ERROR_NONE;
    case XML_TOK_PROLOG_S:
      if (defaultHandler)
        reportDefault(parser, encoding, s, next);
      break;
    case XML_TOK_PI:
      if (!reportProcessingInstruction(parser, encoding, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_COMMENT:
      if (!reportComment(parser, encoding, s, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_INVALID:
      eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (!ps_finalBuffer) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      if (!ps_finalBuffer) {
        *nextPtr = s;
        return XML_ERROR_NONE;
      }
      return XML_ERROR_PARTIAL_CHAR;
    default:
      return XML_ERROR_JUNK_AFTER_DOC_ELEMENT;
    }
    eventPtr = s = next;
    switch (ps_parsing) {
    case XML_SUSPENDED:
      *nextPtr = next;
      return XML_ERROR_NONE;
    case XML_FINISHED:
      return XML_ERROR_ABORTED;
    default: ;
    }
  }
}